

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Object __thiscall Am_Object::Copy(Am_Object *this,char *new_name)

{
  unsigned_short *puVar1;
  long lVar2;
  Am_Constraint_Context *pAVar3;
  Am_Object_Data *pAVar4;
  char *in_RDX;
  Am_Object *new_object;
  
  lVar2 = *(long *)new_name;
  if (lVar2 == 0) {
    Am_Object(this,&Am_Root_Object);
  }
  else {
    if (*(short *)(lVar2 + 0x4c) < 0) {
      Am_Demon_Queue::Invoke((Am_Demon_Queue *)(lVar2 + 0x40));
    }
    this->data = (Am_Object_Data *)0x0;
    pAVar4 = Am_Object_Data::copy_object(*(Am_Object_Data **)new_name,in_RDX);
    this->data = pAVar4;
    puVar1 = &((pAVar4->demon_queue).data)->invoke_stack;
    *puVar1 = *puVar1 + 1;
    pAVar3 = cc;
    cc = Am_Empty_Constraint_Context;
    Am_Object_Data::invoke_copy_demons(pAVar4);
    pAVar4 = this->data;
    puVar1 = &((pAVar4->demon_queue).data)->invoke_stack;
    cc = pAVar3;
    *puVar1 = *puVar1 - 1;
    Am_Object_Data::validate_object(pAVar4);
    Am_Object_Data::note_parts(this->data);
  }
  return (Am_Object)(Am_Object_Data *)this;
}

Assistant:

Am_Object
Am_Object::Copy(const char *new_name) const
{
  if (data) {
    if (data->demons_active & DEMONS_ACTIVE)
      data->demon_queue.Invoke();
    Am_Object new_object;
    new_object.data = data->copy_object(new_name);
    new_object.data->demon_queue.Prevent_Invoke();
    Am_PUSH_EMPTY_CC() new_object.data->invoke_copy_demons();
    Am_POP_EMPTY_CC() new_object.data->demon_queue.Release_Invoke();
    new_object.data->validate_object();
    new_object.data->note_parts();
#ifdef DEBUG
    Global_Call_Object_Trace(*this, new_object, Am_TRACE_OBJECT_COPIED);
#endif
    return new_object;
  } else
    return Am_Root_Object;
}